

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_View.cxx
# Opt level: O0

int __thiscall Fl_Help_View::get_length(Fl_Help_View *this,char *l)

{
  size_t sVar1;
  int local_3c;
  int local_24;
  int scrollsize;
  int val;
  char *l_local;
  Fl_Help_View *this_local;
  
  if (*l == '\0') {
    this_local._4_4_ = 0;
  }
  else {
    local_24 = atoi(l);
    sVar1 = strlen(l);
    if (l[sVar1 - 1] == '%') {
      if (local_24 < 0x65) {
        if (local_24 < 0) {
          local_24 = 0;
        }
      }
      else {
        local_24 = 100;
      }
      if (this->scrollbar_size_ == 0) {
        local_3c = Fl::scrollbar_size();
      }
      else {
        local_3c = this->scrollbar_size_;
      }
      local_24 = (local_24 * (this->hsize_ - local_3c)) / 100;
    }
    this_local._4_4_ = local_24;
  }
  return this_local._4_4_;
}

Assistant:

int
Fl_Help_View::get_length(const char *l) {	// I - Value
  int	val;					// Integer value

  if (!l[0]) return 0;

  val = atoi(l);
  if (l[strlen(l) - 1] == '%') {
    if (val > 100) val = 100;
    else if (val < 0) val = 0;

    int scrollsize = scrollbar_size_ ? scrollbar_size_ : Fl::scrollbar_size();
    val = val * (hsize_ - scrollsize) / 100;
  }

  return val;
}